

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_pack4.h
# Opt level: O0

void ncnn::convdw3x3s1_pack4_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  long lVar25;
  long lVar26;
  undefined8 *puVar27;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  __m128 _r22_3;
  __m128 _r21_3;
  __m128 _r20_3;
  __m128 _r12_3;
  __m128 _r11_3;
  __m128 _r10_3;
  __m128 _r02_3;
  __m128 _r01_3;
  __m128 _r00_3;
  __m128 _sum0_3;
  __m128 _r23_2;
  __m128 _r13_2;
  __m128 _r03_2;
  __m128 _sum1_2;
  __m128 _r22_2;
  __m128 _r21_2;
  __m128 _r20_2;
  __m128 _r12_2;
  __m128 _r11_2;
  __m128 _r10_2;
  __m128 _r02_2;
  __m128 _r01_2;
  __m128 _r00_2;
  __m128 _sum0_2;
  __m128 _r25_1;
  __m128 _r15_1;
  __m128 _r05_1;
  __m128 _sum3_1;
  __m128 _r24_1;
  __m128 _r14_1;
  __m128 _r04_1;
  __m128 _sum2_1;
  __m128 _r23_1;
  __m128 _r13_1;
  __m128 _r03_1;
  __m128 _sum1_1;
  __m128 _r22_1;
  __m128 _r21_1;
  __m128 _r20_1;
  __m128 _r12_1;
  __m128 _r11_1;
  __m128 _r10_1;
  __m128 _r02_1;
  __m128 _r01_1;
  __m128 _r00_1;
  __m128 _sum0_1;
  __m128 _r29;
  __m128 _r19;
  __m128 _r09;
  __m128 _sum7;
  __m128 _r28;
  __m128 _r18;
  __m128 _r08;
  __m128 _sum6;
  __m128 _r27;
  __m128 _r17;
  __m128 _r07;
  __m128 _sum5;
  __m128 _r26;
  __m128 _r16;
  __m128 _r06;
  __m128 _sum4;
  __m128 _r25;
  __m128 _r15;
  __m128 _r05;
  __m128 _sum3;
  __m128 _r24;
  __m128 _r14;
  __m128 _r04;
  __m128 _sum2;
  __m128 _r23;
  __m128 _r13;
  __m128 _r03;
  __m128 _sum1;
  __m128 _r22;
  __m128 _r21;
  __m128 _r20;
  __m128 _r12;
  __m128 _r11;
  __m128 _r10;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  __m128 _sum0;
  int j;
  int i;
  __m128 _k22;
  __m128 _k21;
  __m128 _k20;
  __m128 _k12;
  __m128 _k11;
  __m128 _k10;
  __m128 _k02;
  __m128 _k01;
  __m128 _k00;
  float *r2;
  float *r1;
  float *r0;
  Mat img0;
  float *outptr0;
  float *k0;
  __m128 _bias0;
  Mat out;
  int g;
  float *bias;
  int group;
  int outh;
  int outw;
  Mat *m;
  Mat *m_1;
  float local_4978;
  float fStack_4974;
  float fStack_4970;
  float fStack_496c;
  undefined8 local_4898;
  undefined8 uStack_4890;
  int local_4310;
  int local_430c;
  undefined8 *local_4278;
  undefined8 *local_4270;
  undefined8 *local_4268;
  float *local_4218;
  int local_4194;
  float local_3d28;
  float fStack_3d24;
  float fStack_3d20;
  float fStack_3d1c;
  float local_3cb8;
  float fStack_3cb4;
  float fStack_3cb0;
  float fStack_3cac;
  float local_3c48;
  float fStack_3c44;
  float fStack_3c40;
  float fStack_3c3c;
  float local_3bd8;
  float fStack_3bd4;
  float fStack_3bd0;
  float fStack_3bcc;
  float local_3b68;
  float fStack_3b64;
  float fStack_3b60;
  float fStack_3b5c;
  float local_3af8;
  float fStack_3af4;
  float fStack_3af0;
  float fStack_3aec;
  float local_3a88;
  float fStack_3a84;
  float fStack_3a80;
  float fStack_3a7c;
  float local_3a18;
  float fStack_3a14;
  float fStack_3a10;
  float fStack_3a0c;
  float local_39a8;
  float fStack_39a4;
  float fStack_39a0;
  float fStack_399c;
  float local_3938;
  float fStack_3934;
  float fStack_3930;
  float fStack_392c;
  float local_37e8;
  float fStack_37e4;
  float fStack_37e0;
  float fStack_37dc;
  float local_3698;
  float fStack_3694;
  float fStack_3690;
  float fStack_368c;
  float local_3548;
  float fStack_3544;
  float fStack_3540;
  float fStack_353c;
  float local_34d8;
  float fStack_34d4;
  float fStack_34d0;
  float fStack_34cc;
  float local_3468;
  float fStack_3464;
  float fStack_3460;
  float fStack_345c;
  float local_33f8;
  float fStack_33f4;
  float fStack_33f0;
  float fStack_33ec;
  float local_3388;
  float fStack_3384;
  float fStack_3380;
  float fStack_337c;
  float local_3318;
  float fStack_3314;
  float fStack_3310;
  float fStack_330c;
  float local_32a8;
  float fStack_32a4;
  float fStack_32a0;
  float fStack_329c;
  float local_3238;
  float fStack_3234;
  float fStack_3230;
  float fStack_322c;
  float local_31c8;
  float fStack_31c4;
  float fStack_31c0;
  float fStack_31bc;
  float local_3158;
  float fStack_3154;
  float fStack_3150;
  float fStack_314c;
  float local_3008;
  float fStack_3004;
  float fStack_3000;
  float fStack_2ffc;
  float local_2eb8;
  float fStack_2eb4;
  float fStack_2eb0;
  float fStack_2eac;
  float local_2d68;
  float fStack_2d64;
  float fStack_2d60;
  float fStack_2d5c;
  float local_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  float local_2ac8;
  float fStack_2ac4;
  float fStack_2ac0;
  float fStack_2abc;
  float local_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float local_2828;
  float fStack_2824;
  float fStack_2820;
  float fStack_281c;
  float local_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float local_2588;
  float fStack_2584;
  float fStack_2580;
  float fStack_257c;
  float local_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float local_24a8;
  float fStack_24a4;
  float fStack_24a0;
  float fStack_249c;
  float local_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float local_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  float local_2358;
  float fStack_2354;
  float fStack_2350;
  float fStack_234c;
  float local_22e8;
  float fStack_22e4;
  float fStack_22e0;
  float fStack_22dc;
  float local_2278;
  float fStack_2274;
  float fStack_2270;
  float fStack_226c;
  float local_2208;
  float fStack_2204;
  float fStack_2200;
  float fStack_21fc;
  float local_2198;
  float fStack_2194;
  float fStack_2190;
  float fStack_218c;
  float local_2048;
  float fStack_2044;
  float fStack_2040;
  float fStack_203c;
  float local_1ef8;
  float fStack_1ef4;
  float fStack_1ef0;
  float fStack_1eec;
  float local_1da8;
  float fStack_1da4;
  float fStack_1da0;
  float fStack_1d9c;
  float local_1c58;
  float fStack_1c54;
  float fStack_1c50;
  float fStack_1c4c;
  float local_1b08;
  float fStack_1b04;
  float fStack_1b00;
  float fStack_1afc;
  float local_19b8;
  float fStack_19b4;
  float fStack_19b0;
  float fStack_19ac;
  float local_1868;
  float fStack_1864;
  float fStack_1860;
  float fStack_185c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_15c8;
  float fStack_15c4;
  float fStack_15c0;
  float fStack_15bc;
  float local_1478;
  float fStack_1474;
  float fStack_1470;
  float fStack_146c;
  float local_1328;
  float fStack_1324;
  float fStack_1320;
  float fStack_131c;
  float local_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float local_de8;
  float fStack_de4;
  float fStack_de0;
  float fStack_ddc;
  float local_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float local_608;
  float fStack_604;
  float fStack_600;
  float fStack_5fc;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  
  iVar1 = *(int *)((long)in_RSI + 0x2c);
  lVar25 = in_RSI[6];
  lVar26 = in_RDI[7];
  lVar2 = *in_RCX;
  for (local_4194 = 0; local_4194 < (int)lVar26; local_4194 = local_4194 + 1) {
    local_4218 = (float *)(*in_RSI + in_RSI[8] * (long)local_4194 * in_RSI[2]);
    if (lVar2 == 0) {
      local_4898 = 0;
      uStack_4890 = 0;
    }
    else {
      puVar27 = (undefined8 *)(lVar2 + (long)(local_4194 << 2) * 4);
      local_4898 = *puVar27;
      uStack_4890 = puVar27[1];
    }
    puVar27 = (undefined8 *)
              (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_4194 * in_RDX[2]);
    local_4268 = (undefined8 *)(*in_RDI + in_RDI[8] * (long)local_4194 * in_RDI[2]);
    local_4270 = (undefined8 *)((long)local_4268 + (long)*(int *)((long)in_RDI + 0x2c) * in_RDI[2]);
    local_4278 = (undefined8 *)
                 ((long)local_4268 + (long)*(int *)((long)in_RDI + 0x2c) * 2 * in_RDI[2]);
    uVar3 = *puVar27;
    uVar4 = puVar27[1];
    uVar5 = puVar27[2];
    uVar6 = puVar27[3];
    uVar7 = puVar27[4];
    uVar8 = puVar27[5];
    uVar9 = puVar27[6];
    uVar10 = puVar27[7];
    uVar11 = puVar27[8];
    uVar12 = puVar27[9];
    uVar13 = puVar27[10];
    uVar14 = puVar27[0xb];
    uVar15 = puVar27[0xc];
    uVar16 = puVar27[0xd];
    uVar17 = puVar27[0xe];
    uVar18 = puVar27[0xf];
    local_4978 = (float)puVar27[0x10];
    fStack_4974 = (float)((ulong)puVar27[0x10] >> 0x20);
    fStack_4970 = (float)puVar27[0x11];
    fStack_496c = (float)((ulong)puVar27[0x11] >> 0x20);
    for (local_430c = 0; local_430c < (int)lVar25; local_430c = local_430c + 1) {
      local_4310 = 0;
      while( true ) {
        local_278 = (float)uVar3;
        fStack_274 = (float)((ulong)uVar3 >> 0x20);
        fStack_270 = (float)uVar4;
        fStack_26c = (float)((ulong)uVar4 >> 0x20);
        local_2e8 = (float)uVar5;
        fStack_2e4 = (float)((ulong)uVar5 >> 0x20);
        fStack_2e0 = (float)uVar6;
        fStack_2dc = (float)((ulong)uVar6 >> 0x20);
        local_358 = (float)uVar7;
        fStack_354 = (float)((ulong)uVar7 >> 0x20);
        fStack_350 = (float)uVar8;
        fStack_34c = (float)((ulong)uVar8 >> 0x20);
        local_3c8 = (float)uVar9;
        fStack_3c4 = (float)((ulong)uVar9 >> 0x20);
        fStack_3c0 = (float)uVar10;
        fStack_3bc = (float)((ulong)uVar10 >> 0x20);
        local_438 = (float)uVar11;
        fStack_434 = (float)((ulong)uVar11 >> 0x20);
        fStack_430 = (float)uVar12;
        fStack_42c = (float)((ulong)uVar12 >> 0x20);
        local_4a8 = (float)uVar13;
        fStack_4a4 = (float)((ulong)uVar13 >> 0x20);
        fStack_4a0 = (float)uVar14;
        fStack_49c = (float)((ulong)uVar14 >> 0x20);
        local_518 = (float)uVar15;
        fStack_514 = (float)((ulong)uVar15 >> 0x20);
        fStack_510 = (float)uVar16;
        fStack_50c = (float)((ulong)uVar16 >> 0x20);
        local_588 = (float)uVar17;
        fStack_584 = (float)((ulong)uVar17 >> 0x20);
        fStack_580 = (float)uVar18;
        fStack_57c = (float)((ulong)uVar18 >> 0x20);
        if (iVar1 <= local_4310 + 7) break;
        local_288 = (float)*local_4268;
        fStack_284 = (float)((ulong)*local_4268 >> 0x20);
        fStack_280 = (float)local_4268[1];
        fStack_27c = (float)((ulong)local_4268[1] >> 0x20);
        local_2f8 = (float)local_4268[2];
        fStack_2f4 = (float)((ulong)local_4268[2] >> 0x20);
        fStack_2f0 = (float)local_4268[3];
        fStack_2ec = (float)((ulong)local_4268[3] >> 0x20);
        local_368 = (float)local_4268[4];
        fStack_364 = (float)((ulong)local_4268[4] >> 0x20);
        fStack_360 = (float)local_4268[5];
        fStack_35c = (float)((ulong)local_4268[5] >> 0x20);
        local_3d8 = (float)*local_4270;
        fStack_3d4 = (float)((ulong)*local_4270 >> 0x20);
        fStack_3d0 = (float)local_4270[1];
        fStack_3cc = (float)((ulong)local_4270[1] >> 0x20);
        local_448 = (float)local_4270[2];
        fStack_444 = (float)((ulong)local_4270[2] >> 0x20);
        fStack_440 = (float)local_4270[3];
        fStack_43c = (float)((ulong)local_4270[3] >> 0x20);
        local_4b8 = (float)local_4270[4];
        fStack_4b4 = (float)((ulong)local_4270[4] >> 0x20);
        fStack_4b0 = (float)local_4270[5];
        fStack_4ac = (float)((ulong)local_4270[5] >> 0x20);
        local_528 = (float)*local_4278;
        fStack_524 = (float)((ulong)*local_4278 >> 0x20);
        fStack_520 = (float)local_4278[1];
        fStack_51c = (float)((ulong)local_4278[1] >> 0x20);
        local_598 = (float)local_4278[2];
        fStack_594 = (float)((ulong)local_4278[2] >> 0x20);
        fStack_590 = (float)local_4278[3];
        fStack_58c = (float)((ulong)local_4278[3] >> 0x20);
        local_608 = (float)local_4278[4];
        fStack_604 = (float)((ulong)local_4278[4] >> 0x20);
        fStack_600 = (float)local_4278[5];
        fStack_5fc = (float)((ulong)local_4278[5] >> 0x20);
        uVar19 = local_4268[6];
        uVar20 = local_4268[7];
        uVar21 = local_4270[6];
        uVar22 = local_4270[7];
        uVar23 = local_4278[6];
        uVar24 = local_4278[7];
        *(ulong *)local_4218 =
             CONCAT44(fStack_4974 * fStack_604 +
                      fStack_584 * fStack_594 +
                      fStack_514 * fStack_524 +
                      fStack_4a4 * fStack_4b4 +
                      fStack_434 * fStack_444 +
                      fStack_3c4 * fStack_3d4 +
                      fStack_354 * fStack_364 +
                      fStack_2e4 * fStack_2f4 + fStack_274 * fStack_284 + local_4898._4_4_,
                      local_4978 * local_608 +
                      local_588 * local_598 +
                      local_518 * local_528 +
                      local_4a8 * local_4b8 +
                      local_438 * local_448 +
                      local_3c8 * local_3d8 +
                      local_358 * local_368 +
                      local_2e8 * local_2f8 + local_278 * local_288 + (float)local_4898);
        *(ulong *)(local_4218 + 2) =
             CONCAT44(fStack_496c * fStack_5fc +
                      fStack_57c * fStack_58c +
                      fStack_50c * fStack_51c +
                      fStack_49c * fStack_4ac +
                      fStack_42c * fStack_43c +
                      fStack_3bc * fStack_3cc +
                      fStack_34c * fStack_35c +
                      fStack_2dc * fStack_2ec + fStack_26c * fStack_27c + uStack_4890._4_4_,
                      fStack_4970 * fStack_600 +
                      fStack_580 * fStack_590 +
                      fStack_510 * fStack_520 +
                      fStack_4a0 * fStack_4b0 +
                      fStack_430 * fStack_440 +
                      fStack_3c0 * fStack_3d0 +
                      fStack_350 * fStack_360 +
                      fStack_2e0 * fStack_2f0 + fStack_270 * fStack_280 + (float)uStack_4890);
        local_758 = (float)uVar19;
        fStack_754 = (float)((ulong)uVar19 >> 0x20);
        fStack_750 = (float)uVar20;
        fStack_74c = (float)((ulong)uVar20 >> 0x20);
        local_8a8 = (float)uVar21;
        fStack_8a4 = (float)((ulong)uVar21 >> 0x20);
        fStack_8a0 = (float)uVar22;
        fStack_89c = (float)((ulong)uVar22 >> 0x20);
        local_9f8 = (float)uVar23;
        fStack_9f4 = (float)((ulong)uVar23 >> 0x20);
        fStack_9f0 = (float)uVar24;
        fStack_9ec = (float)((ulong)uVar24 >> 0x20);
        uVar19 = local_4268[8];
        uVar20 = local_4268[9];
        uVar21 = local_4270[8];
        uVar22 = local_4270[9];
        uVar23 = local_4278[8];
        uVar24 = local_4278[9];
        *(ulong *)(local_4218 + 4) =
             CONCAT44(fStack_4974 * fStack_9f4 +
                      fStack_584 * fStack_604 +
                      fStack_514 * fStack_594 +
                      fStack_4a4 * fStack_8a4 +
                      fStack_434 * fStack_4b4 +
                      fStack_3c4 * fStack_444 +
                      fStack_354 * fStack_754 +
                      fStack_2e4 * fStack_364 + fStack_274 * fStack_2f4 + local_4898._4_4_,
                      local_4978 * local_9f8 +
                      local_588 * local_608 +
                      local_518 * local_598 +
                      local_4a8 * local_8a8 +
                      local_438 * local_4b8 +
                      local_3c8 * local_448 +
                      local_358 * local_758 +
                      local_2e8 * local_368 + local_278 * local_2f8 + (float)local_4898);
        *(ulong *)(local_4218 + 6) =
             CONCAT44(fStack_496c * fStack_9ec +
                      fStack_57c * fStack_5fc +
                      fStack_50c * fStack_58c +
                      fStack_49c * fStack_89c +
                      fStack_42c * fStack_4ac +
                      fStack_3bc * fStack_43c +
                      fStack_34c * fStack_74c +
                      fStack_2dc * fStack_35c + fStack_26c * fStack_2ec + uStack_4890._4_4_,
                      fStack_4970 * fStack_9f0 +
                      fStack_580 * fStack_600 +
                      fStack_510 * fStack_590 +
                      fStack_4a0 * fStack_8a0 +
                      fStack_430 * fStack_4b0 +
                      fStack_3c0 * fStack_440 +
                      fStack_350 * fStack_750 +
                      fStack_2e0 * fStack_360 + fStack_270 * fStack_2f0 + (float)uStack_4890);
        local_b48 = (float)uVar19;
        fStack_b44 = (float)((ulong)uVar19 >> 0x20);
        fStack_b40 = (float)uVar20;
        fStack_b3c = (float)((ulong)uVar20 >> 0x20);
        local_c98 = (float)uVar21;
        fStack_c94 = (float)((ulong)uVar21 >> 0x20);
        fStack_c90 = (float)uVar22;
        fStack_c8c = (float)((ulong)uVar22 >> 0x20);
        local_de8 = (float)uVar23;
        fStack_de4 = (float)((ulong)uVar23 >> 0x20);
        fStack_de0 = (float)uVar24;
        fStack_ddc = (float)((ulong)uVar24 >> 0x20);
        uVar19 = local_4268[10];
        uVar20 = local_4268[0xb];
        uVar21 = local_4270[10];
        uVar22 = local_4270[0xb];
        uVar23 = local_4278[10];
        uVar24 = local_4278[0xb];
        *(ulong *)(local_4218 + 8) =
             CONCAT44(fStack_4974 * fStack_de4 +
                      fStack_584 * fStack_9f4 +
                      fStack_514 * fStack_604 +
                      fStack_4a4 * fStack_c94 +
                      fStack_434 * fStack_8a4 +
                      fStack_3c4 * fStack_4b4 +
                      fStack_354 * fStack_b44 +
                      fStack_2e4 * fStack_754 + fStack_274 * fStack_364 + local_4898._4_4_,
                      local_4978 * local_de8 +
                      local_588 * local_9f8 +
                      local_518 * local_608 +
                      local_4a8 * local_c98 +
                      local_438 * local_8a8 +
                      local_3c8 * local_4b8 +
                      local_358 * local_b48 +
                      local_2e8 * local_758 + local_278 * local_368 + (float)local_4898);
        *(ulong *)(local_4218 + 10) =
             CONCAT44(fStack_496c * fStack_ddc +
                      fStack_57c * fStack_9ec +
                      fStack_50c * fStack_5fc +
                      fStack_49c * fStack_c8c +
                      fStack_42c * fStack_89c +
                      fStack_3bc * fStack_4ac +
                      fStack_34c * fStack_b3c +
                      fStack_2dc * fStack_74c + fStack_26c * fStack_35c + uStack_4890._4_4_,
                      fStack_4970 * fStack_de0 +
                      fStack_580 * fStack_9f0 +
                      fStack_510 * fStack_600 +
                      fStack_4a0 * fStack_c90 +
                      fStack_430 * fStack_8a0 +
                      fStack_3c0 * fStack_4b0 +
                      fStack_350 * fStack_b40 +
                      fStack_2e0 * fStack_750 + fStack_270 * fStack_360 + (float)uStack_4890);
        local_f38 = (float)uVar19;
        fStack_f34 = (float)((ulong)uVar19 >> 0x20);
        fStack_f30 = (float)uVar20;
        fStack_f2c = (float)((ulong)uVar20 >> 0x20);
        local_1088 = (float)uVar21;
        fStack_1084 = (float)((ulong)uVar21 >> 0x20);
        fStack_1080 = (float)uVar22;
        fStack_107c = (float)((ulong)uVar22 >> 0x20);
        local_11d8 = (float)uVar23;
        fStack_11d4 = (float)((ulong)uVar23 >> 0x20);
        fStack_11d0 = (float)uVar24;
        fStack_11cc = (float)((ulong)uVar24 >> 0x20);
        uVar19 = local_4268[0xc];
        uVar20 = local_4268[0xd];
        uVar21 = local_4270[0xc];
        uVar22 = local_4270[0xd];
        uVar23 = local_4278[0xc];
        uVar24 = local_4278[0xd];
        *(ulong *)(local_4218 + 0xc) =
             CONCAT44(fStack_4974 * fStack_11d4 +
                      fStack_584 * fStack_de4 +
                      fStack_514 * fStack_9f4 +
                      fStack_4a4 * fStack_1084 +
                      fStack_434 * fStack_c94 +
                      fStack_3c4 * fStack_8a4 +
                      fStack_354 * fStack_f34 +
                      fStack_2e4 * fStack_b44 + fStack_274 * fStack_754 + local_4898._4_4_,
                      local_4978 * local_11d8 +
                      local_588 * local_de8 +
                      local_518 * local_9f8 +
                      local_4a8 * local_1088 +
                      local_438 * local_c98 +
                      local_3c8 * local_8a8 +
                      local_358 * local_f38 +
                      local_2e8 * local_b48 + local_278 * local_758 + (float)local_4898);
        *(ulong *)(local_4218 + 0xe) =
             CONCAT44(fStack_496c * fStack_11cc +
                      fStack_57c * fStack_ddc +
                      fStack_50c * fStack_9ec +
                      fStack_49c * fStack_107c +
                      fStack_42c * fStack_c8c +
                      fStack_3bc * fStack_89c +
                      fStack_34c * fStack_f2c +
                      fStack_2dc * fStack_b3c + fStack_26c * fStack_74c + uStack_4890._4_4_,
                      fStack_4970 * fStack_11d0 +
                      fStack_580 * fStack_de0 +
                      fStack_510 * fStack_9f0 +
                      fStack_4a0 * fStack_1080 +
                      fStack_430 * fStack_c90 +
                      fStack_3c0 * fStack_8a0 +
                      fStack_350 * fStack_f30 +
                      fStack_2e0 * fStack_b40 + fStack_270 * fStack_750 + (float)uStack_4890);
        local_1328 = (float)uVar19;
        fStack_1324 = (float)((ulong)uVar19 >> 0x20);
        fStack_1320 = (float)uVar20;
        fStack_131c = (float)((ulong)uVar20 >> 0x20);
        local_1478 = (float)uVar21;
        fStack_1474 = (float)((ulong)uVar21 >> 0x20);
        fStack_1470 = (float)uVar22;
        fStack_146c = (float)((ulong)uVar22 >> 0x20);
        local_15c8 = (float)uVar23;
        fStack_15c4 = (float)((ulong)uVar23 >> 0x20);
        fStack_15c0 = (float)uVar24;
        fStack_15bc = (float)((ulong)uVar24 >> 0x20);
        uVar19 = local_4268[0xe];
        uVar20 = local_4268[0xf];
        uVar21 = local_4270[0xe];
        uVar22 = local_4270[0xf];
        uVar23 = local_4278[0xe];
        uVar24 = local_4278[0xf];
        *(ulong *)(local_4218 + 0x10) =
             CONCAT44(fStack_4974 * fStack_15c4 +
                      fStack_584 * fStack_11d4 +
                      fStack_514 * fStack_de4 +
                      fStack_4a4 * fStack_1474 +
                      fStack_434 * fStack_1084 +
                      fStack_3c4 * fStack_c94 +
                      fStack_354 * fStack_1324 +
                      fStack_2e4 * fStack_f34 + fStack_274 * fStack_b44 + local_4898._4_4_,
                      local_4978 * local_15c8 +
                      local_588 * local_11d8 +
                      local_518 * local_de8 +
                      local_4a8 * local_1478 +
                      local_438 * local_1088 +
                      local_3c8 * local_c98 +
                      local_358 * local_1328 +
                      local_2e8 * local_f38 + local_278 * local_b48 + (float)local_4898);
        *(ulong *)(local_4218 + 0x12) =
             CONCAT44(fStack_496c * fStack_15bc +
                      fStack_57c * fStack_11cc +
                      fStack_50c * fStack_ddc +
                      fStack_49c * fStack_146c +
                      fStack_42c * fStack_107c +
                      fStack_3bc * fStack_c8c +
                      fStack_34c * fStack_131c +
                      fStack_2dc * fStack_f2c + fStack_26c * fStack_b3c + uStack_4890._4_4_,
                      fStack_4970 * fStack_15c0 +
                      fStack_580 * fStack_11d0 +
                      fStack_510 * fStack_de0 +
                      fStack_4a0 * fStack_1470 +
                      fStack_430 * fStack_1080 +
                      fStack_3c0 * fStack_c90 +
                      fStack_350 * fStack_1320 +
                      fStack_2e0 * fStack_f30 + fStack_270 * fStack_b40 + (float)uStack_4890);
        local_1718 = (float)uVar19;
        fStack_1714 = (float)((ulong)uVar19 >> 0x20);
        fStack_1710 = (float)uVar20;
        fStack_170c = (float)((ulong)uVar20 >> 0x20);
        local_1868 = (float)uVar21;
        fStack_1864 = (float)((ulong)uVar21 >> 0x20);
        fStack_1860 = (float)uVar22;
        fStack_185c = (float)((ulong)uVar22 >> 0x20);
        local_19b8 = (float)uVar23;
        fStack_19b4 = (float)((ulong)uVar23 >> 0x20);
        fStack_19b0 = (float)uVar24;
        fStack_19ac = (float)((ulong)uVar24 >> 0x20);
        uVar19 = local_4268[0x10];
        uVar20 = local_4268[0x11];
        uVar21 = local_4270[0x10];
        uVar22 = local_4270[0x11];
        uVar23 = local_4278[0x10];
        uVar24 = local_4278[0x11];
        *(ulong *)(local_4218 + 0x14) =
             CONCAT44(fStack_4974 * fStack_19b4 +
                      fStack_584 * fStack_15c4 +
                      fStack_514 * fStack_11d4 +
                      fStack_4a4 * fStack_1864 +
                      fStack_434 * fStack_1474 +
                      fStack_3c4 * fStack_1084 +
                      fStack_354 * fStack_1714 +
                      fStack_2e4 * fStack_1324 + fStack_274 * fStack_f34 + local_4898._4_4_,
                      local_4978 * local_19b8 +
                      local_588 * local_15c8 +
                      local_518 * local_11d8 +
                      local_4a8 * local_1868 +
                      local_438 * local_1478 +
                      local_3c8 * local_1088 +
                      local_358 * local_1718 +
                      local_2e8 * local_1328 + local_278 * local_f38 + (float)local_4898);
        *(ulong *)(local_4218 + 0x16) =
             CONCAT44(fStack_496c * fStack_19ac +
                      fStack_57c * fStack_15bc +
                      fStack_50c * fStack_11cc +
                      fStack_49c * fStack_185c +
                      fStack_42c * fStack_146c +
                      fStack_3bc * fStack_107c +
                      fStack_34c * fStack_170c +
                      fStack_2dc * fStack_131c + fStack_26c * fStack_f2c + uStack_4890._4_4_,
                      fStack_4970 * fStack_19b0 +
                      fStack_580 * fStack_15c0 +
                      fStack_510 * fStack_11d0 +
                      fStack_4a0 * fStack_1860 +
                      fStack_430 * fStack_1470 +
                      fStack_3c0 * fStack_1080 +
                      fStack_350 * fStack_1710 +
                      fStack_2e0 * fStack_1320 + fStack_270 * fStack_f30 + (float)uStack_4890);
        local_1b08 = (float)uVar19;
        fStack_1b04 = (float)((ulong)uVar19 >> 0x20);
        fStack_1b00 = (float)uVar20;
        fStack_1afc = (float)((ulong)uVar20 >> 0x20);
        local_1c58 = (float)uVar21;
        fStack_1c54 = (float)((ulong)uVar21 >> 0x20);
        fStack_1c50 = (float)uVar22;
        fStack_1c4c = (float)((ulong)uVar22 >> 0x20);
        local_1da8 = (float)uVar23;
        fStack_1da4 = (float)((ulong)uVar23 >> 0x20);
        fStack_1da0 = (float)uVar24;
        fStack_1d9c = (float)((ulong)uVar24 >> 0x20);
        uVar19 = local_4268[0x12];
        uVar20 = local_4268[0x13];
        uVar21 = local_4270[0x12];
        uVar22 = local_4270[0x13];
        uVar23 = local_4278[0x12];
        uVar24 = local_4278[0x13];
        *(ulong *)(local_4218 + 0x18) =
             CONCAT44(fStack_4974 * fStack_1da4 +
                      fStack_584 * fStack_19b4 +
                      fStack_514 * fStack_15c4 +
                      fStack_4a4 * fStack_1c54 +
                      fStack_434 * fStack_1864 +
                      fStack_3c4 * fStack_1474 +
                      fStack_354 * fStack_1b04 +
                      fStack_2e4 * fStack_1714 + fStack_274 * fStack_1324 + local_4898._4_4_,
                      local_4978 * local_1da8 +
                      local_588 * local_19b8 +
                      local_518 * local_15c8 +
                      local_4a8 * local_1c58 +
                      local_438 * local_1868 +
                      local_3c8 * local_1478 +
                      local_358 * local_1b08 +
                      local_2e8 * local_1718 + local_278 * local_1328 + (float)local_4898);
        *(ulong *)(local_4218 + 0x1a) =
             CONCAT44(fStack_496c * fStack_1d9c +
                      fStack_57c * fStack_19ac +
                      fStack_50c * fStack_15bc +
                      fStack_49c * fStack_1c4c +
                      fStack_42c * fStack_185c +
                      fStack_3bc * fStack_146c +
                      fStack_34c * fStack_1afc +
                      fStack_2dc * fStack_170c + fStack_26c * fStack_131c + uStack_4890._4_4_,
                      fStack_4970 * fStack_1da0 +
                      fStack_580 * fStack_19b0 +
                      fStack_510 * fStack_15c0 +
                      fStack_4a0 * fStack_1c50 +
                      fStack_430 * fStack_1860 +
                      fStack_3c0 * fStack_1470 +
                      fStack_350 * fStack_1b00 +
                      fStack_2e0 * fStack_1710 + fStack_270 * fStack_1320 + (float)uStack_4890);
        local_1ef8 = (float)uVar19;
        fStack_1ef4 = (float)((ulong)uVar19 >> 0x20);
        fStack_1ef0 = (float)uVar20;
        fStack_1eec = (float)((ulong)uVar20 >> 0x20);
        local_2048 = (float)uVar21;
        fStack_2044 = (float)((ulong)uVar21 >> 0x20);
        fStack_2040 = (float)uVar22;
        fStack_203c = (float)((ulong)uVar22 >> 0x20);
        local_2198 = (float)uVar23;
        fStack_2194 = (float)((ulong)uVar23 >> 0x20);
        fStack_2190 = (float)uVar24;
        fStack_218c = (float)((ulong)uVar24 >> 0x20);
        local_4218[0x1c] =
             local_4978 * local_2198 +
             local_588 * local_1da8 +
             local_518 * local_19b8 +
             local_4a8 * local_2048 +
             local_438 * local_1c58 +
             local_3c8 * local_1868 +
             local_358 * local_1ef8 +
             local_2e8 * local_1b08 + local_278 * local_1718 + (float)local_4898;
        local_4218[0x1d] =
             fStack_4974 * fStack_2194 +
             fStack_584 * fStack_1da4 +
             fStack_514 * fStack_19b4 +
             fStack_4a4 * fStack_2044 +
             fStack_434 * fStack_1c54 +
             fStack_3c4 * fStack_1864 +
             fStack_354 * fStack_1ef4 +
             fStack_2e4 * fStack_1b04 + fStack_274 * fStack_1714 + local_4898._4_4_;
        local_4218[0x1e] =
             fStack_4970 * fStack_2190 +
             fStack_580 * fStack_1da0 +
             fStack_510 * fStack_19b0 +
             fStack_4a0 * fStack_2040 +
             fStack_430 * fStack_1c50 +
             fStack_3c0 * fStack_1860 +
             fStack_350 * fStack_1ef0 +
             fStack_2e0 * fStack_1b00 + fStack_270 * fStack_1710 + (float)uStack_4890;
        local_4218[0x1f] =
             fStack_496c * fStack_218c +
             fStack_57c * fStack_1d9c +
             fStack_50c * fStack_19ac +
             fStack_49c * fStack_203c +
             fStack_42c * fStack_1c4c +
             fStack_3bc * fStack_185c +
             fStack_34c * fStack_1eec +
             fStack_2dc * fStack_1afc + fStack_26c * fStack_170c + uStack_4890._4_4_;
        local_4268 = local_4268 + 0x10;
        local_4270 = local_4270 + 0x10;
        local_4278 = local_4278 + 0x10;
        local_4218 = local_4218 + 0x20;
        local_4310 = local_4310 + 8;
      }
      for (; local_4310 + 3 < iVar1; local_4310 = local_4310 + 4) {
        local_2208 = (float)*local_4268;
        fStack_2204 = (float)((ulong)*local_4268 >> 0x20);
        fStack_2200 = (float)local_4268[1];
        fStack_21fc = (float)((ulong)local_4268[1] >> 0x20);
        local_2278 = (float)local_4268[2];
        fStack_2274 = (float)((ulong)local_4268[2] >> 0x20);
        fStack_2270 = (float)local_4268[3];
        fStack_226c = (float)((ulong)local_4268[3] >> 0x20);
        local_22e8 = (float)local_4268[4];
        fStack_22e4 = (float)((ulong)local_4268[4] >> 0x20);
        fStack_22e0 = (float)local_4268[5];
        fStack_22dc = (float)((ulong)local_4268[5] >> 0x20);
        local_2358 = (float)*local_4270;
        fStack_2354 = (float)((ulong)*local_4270 >> 0x20);
        fStack_2350 = (float)local_4270[1];
        fStack_234c = (float)((ulong)local_4270[1] >> 0x20);
        local_23c8 = (float)local_4270[2];
        fStack_23c4 = (float)((ulong)local_4270[2] >> 0x20);
        fStack_23c0 = (float)local_4270[3];
        fStack_23bc = (float)((ulong)local_4270[3] >> 0x20);
        local_2438 = (float)local_4270[4];
        fStack_2434 = (float)((ulong)local_4270[4] >> 0x20);
        fStack_2430 = (float)local_4270[5];
        fStack_242c = (float)((ulong)local_4270[5] >> 0x20);
        local_24a8 = (float)*local_4278;
        fStack_24a4 = (float)((ulong)*local_4278 >> 0x20);
        fStack_24a0 = (float)local_4278[1];
        fStack_249c = (float)((ulong)local_4278[1] >> 0x20);
        local_2518 = (float)local_4278[2];
        fStack_2514 = (float)((ulong)local_4278[2] >> 0x20);
        fStack_2510 = (float)local_4278[3];
        fStack_250c = (float)((ulong)local_4278[3] >> 0x20);
        local_2588 = (float)local_4278[4];
        fStack_2584 = (float)((ulong)local_4278[4] >> 0x20);
        fStack_2580 = (float)local_4278[5];
        fStack_257c = (float)((ulong)local_4278[5] >> 0x20);
        uVar19 = local_4268[6];
        uVar20 = local_4268[7];
        uVar21 = local_4270[6];
        uVar22 = local_4270[7];
        uVar23 = local_4278[6];
        uVar24 = local_4278[7];
        *(ulong *)local_4218 =
             CONCAT44(fStack_4974 * fStack_2584 +
                      fStack_584 * fStack_2514 +
                      fStack_514 * fStack_24a4 +
                      fStack_4a4 * fStack_2434 +
                      fStack_434 * fStack_23c4 +
                      fStack_3c4 * fStack_2354 +
                      fStack_354 * fStack_22e4 +
                      fStack_2e4 * fStack_2274 + fStack_274 * fStack_2204 + local_4898._4_4_,
                      local_4978 * local_2588 +
                      local_588 * local_2518 +
                      local_518 * local_24a8 +
                      local_4a8 * local_2438 +
                      local_438 * local_23c8 +
                      local_3c8 * local_2358 +
                      local_358 * local_22e8 +
                      local_2e8 * local_2278 + local_278 * local_2208 + (float)local_4898);
        *(ulong *)(local_4218 + 2) =
             CONCAT44(fStack_496c * fStack_257c +
                      fStack_57c * fStack_250c +
                      fStack_50c * fStack_249c +
                      fStack_49c * fStack_242c +
                      fStack_42c * fStack_23bc +
                      fStack_3bc * fStack_234c +
                      fStack_34c * fStack_22dc +
                      fStack_2dc * fStack_226c + fStack_26c * fStack_21fc + uStack_4890._4_4_,
                      fStack_4970 * fStack_2580 +
                      fStack_580 * fStack_2510 +
                      fStack_510 * fStack_24a0 +
                      fStack_4a0 * fStack_2430 +
                      fStack_430 * fStack_23c0 +
                      fStack_3c0 * fStack_2350 +
                      fStack_350 * fStack_22e0 +
                      fStack_2e0 * fStack_2270 + fStack_270 * fStack_2200 + (float)uStack_4890);
        local_26d8 = (float)uVar19;
        fStack_26d4 = (float)((ulong)uVar19 >> 0x20);
        fStack_26d0 = (float)uVar20;
        fStack_26cc = (float)((ulong)uVar20 >> 0x20);
        local_2828 = (float)uVar21;
        fStack_2824 = (float)((ulong)uVar21 >> 0x20);
        fStack_2820 = (float)uVar22;
        fStack_281c = (float)((ulong)uVar22 >> 0x20);
        local_2978 = (float)uVar23;
        fStack_2974 = (float)((ulong)uVar23 >> 0x20);
        fStack_2970 = (float)uVar24;
        fStack_296c = (float)((ulong)uVar24 >> 0x20);
        uVar19 = local_4268[8];
        uVar20 = local_4268[9];
        uVar21 = local_4270[8];
        uVar22 = local_4270[9];
        uVar23 = local_4278[8];
        uVar24 = local_4278[9];
        *(ulong *)(local_4218 + 4) =
             CONCAT44(fStack_4974 * fStack_2974 +
                      fStack_584 * fStack_2584 +
                      fStack_514 * fStack_2514 +
                      fStack_4a4 * fStack_2824 +
                      fStack_434 * fStack_2434 +
                      fStack_3c4 * fStack_23c4 +
                      fStack_354 * fStack_26d4 +
                      fStack_2e4 * fStack_22e4 + fStack_274 * fStack_2274 + local_4898._4_4_,
                      local_4978 * local_2978 +
                      local_588 * local_2588 +
                      local_518 * local_2518 +
                      local_4a8 * local_2828 +
                      local_438 * local_2438 +
                      local_3c8 * local_23c8 +
                      local_358 * local_26d8 +
                      local_2e8 * local_22e8 + local_278 * local_2278 + (float)local_4898);
        *(ulong *)(local_4218 + 6) =
             CONCAT44(fStack_496c * fStack_296c +
                      fStack_57c * fStack_257c +
                      fStack_50c * fStack_250c +
                      fStack_49c * fStack_281c +
                      fStack_42c * fStack_242c +
                      fStack_3bc * fStack_23bc +
                      fStack_34c * fStack_26cc +
                      fStack_2dc * fStack_22dc + fStack_26c * fStack_226c + uStack_4890._4_4_,
                      fStack_4970 * fStack_2970 +
                      fStack_580 * fStack_2580 +
                      fStack_510 * fStack_2510 +
                      fStack_4a0 * fStack_2820 +
                      fStack_430 * fStack_2430 +
                      fStack_3c0 * fStack_23c0 +
                      fStack_350 * fStack_26d0 +
                      fStack_2e0 * fStack_22e0 + fStack_270 * fStack_2270 + (float)uStack_4890);
        local_2ac8 = (float)uVar19;
        fStack_2ac4 = (float)((ulong)uVar19 >> 0x20);
        fStack_2ac0 = (float)uVar20;
        fStack_2abc = (float)((ulong)uVar20 >> 0x20);
        local_2c18 = (float)uVar21;
        fStack_2c14 = (float)((ulong)uVar21 >> 0x20);
        fStack_2c10 = (float)uVar22;
        fStack_2c0c = (float)((ulong)uVar22 >> 0x20);
        local_2d68 = (float)uVar23;
        fStack_2d64 = (float)((ulong)uVar23 >> 0x20);
        fStack_2d60 = (float)uVar24;
        fStack_2d5c = (float)((ulong)uVar24 >> 0x20);
        uVar19 = local_4268[10];
        uVar20 = local_4268[0xb];
        uVar21 = local_4270[10];
        uVar22 = local_4270[0xb];
        uVar23 = local_4278[10];
        uVar24 = local_4278[0xb];
        *(ulong *)(local_4218 + 8) =
             CONCAT44(fStack_4974 * fStack_2d64 +
                      fStack_584 * fStack_2974 +
                      fStack_514 * fStack_2584 +
                      fStack_4a4 * fStack_2c14 +
                      fStack_434 * fStack_2824 +
                      fStack_3c4 * fStack_2434 +
                      fStack_354 * fStack_2ac4 +
                      fStack_2e4 * fStack_26d4 + fStack_274 * fStack_22e4 + local_4898._4_4_,
                      local_4978 * local_2d68 +
                      local_588 * local_2978 +
                      local_518 * local_2588 +
                      local_4a8 * local_2c18 +
                      local_438 * local_2828 +
                      local_3c8 * local_2438 +
                      local_358 * local_2ac8 +
                      local_2e8 * local_26d8 + local_278 * local_22e8 + (float)local_4898);
        *(ulong *)(local_4218 + 10) =
             CONCAT44(fStack_496c * fStack_2d5c +
                      fStack_57c * fStack_296c +
                      fStack_50c * fStack_257c +
                      fStack_49c * fStack_2c0c +
                      fStack_42c * fStack_281c +
                      fStack_3bc * fStack_242c +
                      fStack_34c * fStack_2abc +
                      fStack_2dc * fStack_26cc + fStack_26c * fStack_22dc + uStack_4890._4_4_,
                      fStack_4970 * fStack_2d60 +
                      fStack_580 * fStack_2970 +
                      fStack_510 * fStack_2580 +
                      fStack_4a0 * fStack_2c10 +
                      fStack_430 * fStack_2820 +
                      fStack_3c0 * fStack_2430 +
                      fStack_350 * fStack_2ac0 +
                      fStack_2e0 * fStack_26d0 + fStack_270 * fStack_22e0 + (float)uStack_4890);
        local_2eb8 = (float)uVar19;
        fStack_2eb4 = (float)((ulong)uVar19 >> 0x20);
        fStack_2eb0 = (float)uVar20;
        fStack_2eac = (float)((ulong)uVar20 >> 0x20);
        local_3008 = (float)uVar21;
        fStack_3004 = (float)((ulong)uVar21 >> 0x20);
        fStack_3000 = (float)uVar22;
        fStack_2ffc = (float)((ulong)uVar22 >> 0x20);
        local_3158 = (float)uVar23;
        fStack_3154 = (float)((ulong)uVar23 >> 0x20);
        fStack_3150 = (float)uVar24;
        fStack_314c = (float)((ulong)uVar24 >> 0x20);
        local_4218[0xc] =
             local_4978 * local_3158 +
             local_588 * local_2d68 +
             local_518 * local_2978 +
             local_4a8 * local_3008 +
             local_438 * local_2c18 +
             local_3c8 * local_2828 +
             local_358 * local_2eb8 +
             local_2e8 * local_2ac8 + local_278 * local_26d8 + (float)local_4898;
        local_4218[0xd] =
             fStack_4974 * fStack_3154 +
             fStack_584 * fStack_2d64 +
             fStack_514 * fStack_2974 +
             fStack_4a4 * fStack_3004 +
             fStack_434 * fStack_2c14 +
             fStack_3c4 * fStack_2824 +
             fStack_354 * fStack_2eb4 +
             fStack_2e4 * fStack_2ac4 + fStack_274 * fStack_26d4 + local_4898._4_4_;
        local_4218[0xe] =
             fStack_4970 * fStack_3150 +
             fStack_580 * fStack_2d60 +
             fStack_510 * fStack_2970 +
             fStack_4a0 * fStack_3000 +
             fStack_430 * fStack_2c10 +
             fStack_3c0 * fStack_2820 +
             fStack_350 * fStack_2eb0 +
             fStack_2e0 * fStack_2ac0 + fStack_270 * fStack_26d0 + (float)uStack_4890;
        local_4218[0xf] =
             fStack_496c * fStack_314c +
             fStack_57c * fStack_2d5c +
             fStack_50c * fStack_296c +
             fStack_49c * fStack_2ffc +
             fStack_42c * fStack_2c0c +
             fStack_3bc * fStack_281c +
             fStack_34c * fStack_2eac +
             fStack_2dc * fStack_2abc + fStack_26c * fStack_26cc + uStack_4890._4_4_;
        local_4268 = local_4268 + 8;
        local_4270 = local_4270 + 8;
        local_4278 = local_4278 + 8;
        local_4218 = local_4218 + 0x10;
      }
      for (; local_4310 + 1 < iVar1; local_4310 = local_4310 + 2) {
        local_31c8 = (float)*local_4268;
        fStack_31c4 = (float)((ulong)*local_4268 >> 0x20);
        fStack_31c0 = (float)local_4268[1];
        fStack_31bc = (float)((ulong)local_4268[1] >> 0x20);
        local_3238 = (float)local_4268[2];
        fStack_3234 = (float)((ulong)local_4268[2] >> 0x20);
        fStack_3230 = (float)local_4268[3];
        fStack_322c = (float)((ulong)local_4268[3] >> 0x20);
        local_32a8 = (float)local_4268[4];
        fStack_32a4 = (float)((ulong)local_4268[4] >> 0x20);
        fStack_32a0 = (float)local_4268[5];
        fStack_329c = (float)((ulong)local_4268[5] >> 0x20);
        local_3318 = (float)*local_4270;
        fStack_3314 = (float)((ulong)*local_4270 >> 0x20);
        fStack_3310 = (float)local_4270[1];
        fStack_330c = (float)((ulong)local_4270[1] >> 0x20);
        local_3388 = (float)local_4270[2];
        fStack_3384 = (float)((ulong)local_4270[2] >> 0x20);
        fStack_3380 = (float)local_4270[3];
        fStack_337c = (float)((ulong)local_4270[3] >> 0x20);
        local_33f8 = (float)local_4270[4];
        fStack_33f4 = (float)((ulong)local_4270[4] >> 0x20);
        fStack_33f0 = (float)local_4270[5];
        fStack_33ec = (float)((ulong)local_4270[5] >> 0x20);
        local_3468 = (float)*local_4278;
        fStack_3464 = (float)((ulong)*local_4278 >> 0x20);
        fStack_3460 = (float)local_4278[1];
        fStack_345c = (float)((ulong)local_4278[1] >> 0x20);
        local_34d8 = (float)local_4278[2];
        fStack_34d4 = (float)((ulong)local_4278[2] >> 0x20);
        fStack_34d0 = (float)local_4278[3];
        fStack_34cc = (float)((ulong)local_4278[3] >> 0x20);
        local_3548 = (float)local_4278[4];
        fStack_3544 = (float)((ulong)local_4278[4] >> 0x20);
        fStack_3540 = (float)local_4278[5];
        fStack_353c = (float)((ulong)local_4278[5] >> 0x20);
        uVar19 = local_4268[6];
        uVar20 = local_4268[7];
        uVar21 = local_4270[6];
        uVar22 = local_4270[7];
        uVar23 = local_4278[6];
        uVar24 = local_4278[7];
        *(ulong *)local_4218 =
             CONCAT44(fStack_4974 * fStack_3544 +
                      fStack_584 * fStack_34d4 +
                      fStack_514 * fStack_3464 +
                      fStack_4a4 * fStack_33f4 +
                      fStack_434 * fStack_3384 +
                      fStack_3c4 * fStack_3314 +
                      fStack_354 * fStack_32a4 +
                      fStack_2e4 * fStack_3234 + fStack_274 * fStack_31c4 + local_4898._4_4_,
                      local_4978 * local_3548 +
                      local_588 * local_34d8 +
                      local_518 * local_3468 +
                      local_4a8 * local_33f8 +
                      local_438 * local_3388 +
                      local_3c8 * local_3318 +
                      local_358 * local_32a8 +
                      local_2e8 * local_3238 + local_278 * local_31c8 + (float)local_4898);
        *(ulong *)(local_4218 + 2) =
             CONCAT44(fStack_496c * fStack_353c +
                      fStack_57c * fStack_34cc +
                      fStack_50c * fStack_345c +
                      fStack_49c * fStack_33ec +
                      fStack_42c * fStack_337c +
                      fStack_3bc * fStack_330c +
                      fStack_34c * fStack_329c +
                      fStack_2dc * fStack_322c + fStack_26c * fStack_31bc + uStack_4890._4_4_,
                      fStack_4970 * fStack_3540 +
                      fStack_580 * fStack_34d0 +
                      fStack_510 * fStack_3460 +
                      fStack_4a0 * fStack_33f0 +
                      fStack_430 * fStack_3380 +
                      fStack_3c0 * fStack_3310 +
                      fStack_350 * fStack_32a0 +
                      fStack_2e0 * fStack_3230 + fStack_270 * fStack_31c0 + (float)uStack_4890);
        local_3698 = (float)uVar19;
        fStack_3694 = (float)((ulong)uVar19 >> 0x20);
        fStack_3690 = (float)uVar20;
        fStack_368c = (float)((ulong)uVar20 >> 0x20);
        local_37e8 = (float)uVar21;
        fStack_37e4 = (float)((ulong)uVar21 >> 0x20);
        fStack_37e0 = (float)uVar22;
        fStack_37dc = (float)((ulong)uVar22 >> 0x20);
        local_3938 = (float)uVar23;
        fStack_3934 = (float)((ulong)uVar23 >> 0x20);
        fStack_3930 = (float)uVar24;
        fStack_392c = (float)((ulong)uVar24 >> 0x20);
        local_4218[4] =
             local_4978 * local_3938 +
             local_588 * local_3548 +
             local_518 * local_34d8 +
             local_4a8 * local_37e8 +
             local_438 * local_33f8 +
             local_3c8 * local_3388 +
             local_358 * local_3698 +
             local_2e8 * local_32a8 + local_278 * local_3238 + (float)local_4898;
        local_4218[5] =
             fStack_4974 * fStack_3934 +
             fStack_584 * fStack_3544 +
             fStack_514 * fStack_34d4 +
             fStack_4a4 * fStack_37e4 +
             fStack_434 * fStack_33f4 +
             fStack_3c4 * fStack_3384 +
             fStack_354 * fStack_3694 +
             fStack_2e4 * fStack_32a4 + fStack_274 * fStack_3234 + local_4898._4_4_;
        local_4218[6] =
             fStack_4970 * fStack_3930 +
             fStack_580 * fStack_3540 +
             fStack_510 * fStack_34d0 +
             fStack_4a0 * fStack_37e0 +
             fStack_430 * fStack_33f0 +
             fStack_3c0 * fStack_3380 +
             fStack_350 * fStack_3690 +
             fStack_2e0 * fStack_32a0 + fStack_270 * fStack_3230 + (float)uStack_4890;
        local_4218[7] =
             fStack_496c * fStack_392c +
             fStack_57c * fStack_353c +
             fStack_50c * fStack_34cc +
             fStack_49c * fStack_37dc +
             fStack_42c * fStack_33ec +
             fStack_3bc * fStack_337c +
             fStack_34c * fStack_368c +
             fStack_2dc * fStack_329c + fStack_26c * fStack_322c + uStack_4890._4_4_;
        local_4268 = local_4268 + 4;
        local_4270 = local_4270 + 4;
        local_4278 = local_4278 + 4;
        local_4218 = local_4218 + 8;
      }
      for (; local_4310 < iVar1; local_4310 = local_4310 + 1) {
        local_39a8 = (float)*local_4268;
        fStack_39a4 = (float)((ulong)*local_4268 >> 0x20);
        fStack_39a0 = (float)local_4268[1];
        fStack_399c = (float)((ulong)local_4268[1] >> 0x20);
        local_3a18 = (float)local_4268[2];
        fStack_3a14 = (float)((ulong)local_4268[2] >> 0x20);
        fStack_3a10 = (float)local_4268[3];
        fStack_3a0c = (float)((ulong)local_4268[3] >> 0x20);
        local_3a88 = (float)local_4268[4];
        fStack_3a84 = (float)((ulong)local_4268[4] >> 0x20);
        fStack_3a80 = (float)local_4268[5];
        fStack_3a7c = (float)((ulong)local_4268[5] >> 0x20);
        local_3af8 = (float)*local_4270;
        fStack_3af4 = (float)((ulong)*local_4270 >> 0x20);
        fStack_3af0 = (float)local_4270[1];
        fStack_3aec = (float)((ulong)local_4270[1] >> 0x20);
        local_3b68 = (float)local_4270[2];
        fStack_3b64 = (float)((ulong)local_4270[2] >> 0x20);
        fStack_3b60 = (float)local_4270[3];
        fStack_3b5c = (float)((ulong)local_4270[3] >> 0x20);
        local_3bd8 = (float)local_4270[4];
        fStack_3bd4 = (float)((ulong)local_4270[4] >> 0x20);
        fStack_3bd0 = (float)local_4270[5];
        fStack_3bcc = (float)((ulong)local_4270[5] >> 0x20);
        local_3c48 = (float)*local_4278;
        fStack_3c44 = (float)((ulong)*local_4278 >> 0x20);
        fStack_3c40 = (float)local_4278[1];
        fStack_3c3c = (float)((ulong)local_4278[1] >> 0x20);
        local_3cb8 = (float)local_4278[2];
        fStack_3cb4 = (float)((ulong)local_4278[2] >> 0x20);
        fStack_3cb0 = (float)local_4278[3];
        fStack_3cac = (float)((ulong)local_4278[3] >> 0x20);
        local_3d28 = (float)local_4278[4];
        fStack_3d24 = (float)((ulong)local_4278[4] >> 0x20);
        fStack_3d20 = (float)local_4278[5];
        fStack_3d1c = (float)((ulong)local_4278[5] >> 0x20);
        *local_4218 = local_4978 * local_3d28 +
                      local_588 * local_3cb8 +
                      local_518 * local_3c48 +
                      local_4a8 * local_3bd8 +
                      local_438 * local_3b68 +
                      local_3c8 * local_3af8 +
                      local_358 * local_3a88 +
                      local_2e8 * local_3a18 + local_278 * local_39a8 + (float)local_4898;
        local_4218[1] =
             fStack_4974 * fStack_3d24 +
             fStack_584 * fStack_3cb4 +
             fStack_514 * fStack_3c44 +
             fStack_4a4 * fStack_3bd4 +
             fStack_434 * fStack_3b64 +
             fStack_3c4 * fStack_3af4 +
             fStack_354 * fStack_3a84 +
             fStack_2e4 * fStack_3a14 + fStack_274 * fStack_39a4 + local_4898._4_4_;
        local_4218[2] =
             fStack_4970 * fStack_3d20 +
             fStack_580 * fStack_3cb0 +
             fStack_510 * fStack_3c40 +
             fStack_4a0 * fStack_3bd0 +
             fStack_430 * fStack_3b60 +
             fStack_3c0 * fStack_3af0 +
             fStack_350 * fStack_3a80 +
             fStack_2e0 * fStack_3a10 + fStack_270 * fStack_39a0 + (float)uStack_4890;
        local_4218[3] =
             fStack_496c * fStack_3d1c +
             fStack_57c * fStack_3cac +
             fStack_50c * fStack_3c3c +
             fStack_49c * fStack_3bcc +
             fStack_42c * fStack_3b5c +
             fStack_3bc * fStack_3aec +
             fStack_34c * fStack_3a7c +
             fStack_2dc * fStack_3a0c + fStack_26c * fStack_399c + uStack_4890._4_4_;
        local_4268 = local_4268 + 2;
        local_4270 = local_4270 + 2;
        local_4278 = local_4278 + 2;
        local_4218 = local_4218 + 4;
      }
      local_4268 = local_4268 + 4;
      local_4270 = local_4270 + 4;
      local_4278 = local_4278 + 4;
    }
  }
  return;
}

Assistant:

static void convdw3x3s1_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int outw = top_blob.w;
    int outh = top_blob.h;

    const int group = bottom_blob.c;

    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        Mat out = top_blob.channel(g);

        __m128 _bias0 = bias ? _mm_loadu_ps((const float*)bias + g * 4) : _mm_set1_ps(0.f);

        const float* k0 = kernel.row(g);

        float* outptr0 = out.row(0);

        const Mat img0 = bottom_blob.channel(g);

        const float* r0 = img0.row(0);
        const float* r1 = img0.row(1);
        const float* r2 = img0.row(2);

        __m128 _k00 = _mm_load_ps(k0);
        __m128 _k01 = _mm_load_ps(k0 + 4);
        __m128 _k02 = _mm_load_ps(k0 + 8);
        __m128 _k10 = _mm_load_ps(k0 + 12);
        __m128 _k11 = _mm_load_ps(k0 + 16);
        __m128 _k12 = _mm_load_ps(k0 + 20);
        __m128 _k20 = _mm_load_ps(k0 + 24);
        __m128 _k21 = _mm_load_ps(k0 + 28);
        __m128 _k22 = _mm_load_ps(k0 + 32);

        int i = 0;

        for (; i < outh; i++)
        {
            int j = 0;
            for (; j + 7 < outw; j += 8)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                __m128 _sum4 = _bias0;
                __m128 _r06 = _mm_load_ps(r0 + 24);
                __m128 _r16 = _mm_load_ps(r1 + 24);
                __m128 _r26 = _mm_load_ps(r2 + 24);
                _mm_store_ps(outptr0 + 12, _sum3);

                _sum4 = _mm_comp_fmadd_ps(_k00, _r04, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k01, _r05, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k02, _r06, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k10, _r14, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k11, _r15, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k12, _r16, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k20, _r24, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k21, _r25, _sum4);
                _sum4 = _mm_comp_fmadd_ps(_k22, _r26, _sum4);

                __m128 _sum5 = _bias0;
                __m128 _r07 = _mm_load_ps(r0 + 28);
                __m128 _r17 = _mm_load_ps(r1 + 28);
                __m128 _r27 = _mm_load_ps(r2 + 28);
                _mm_store_ps(outptr0 + 16, _sum4);

                _sum5 = _mm_comp_fmadd_ps(_k00, _r05, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k01, _r06, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k02, _r07, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k10, _r15, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k11, _r16, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k12, _r17, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k20, _r25, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k21, _r26, _sum5);
                _sum5 = _mm_comp_fmadd_ps(_k22, _r27, _sum5);

                __m128 _sum6 = _bias0;
                __m128 _r08 = _mm_load_ps(r0 + 32);
                __m128 _r18 = _mm_load_ps(r1 + 32);
                __m128 _r28 = _mm_load_ps(r2 + 32);
                _mm_store_ps(outptr0 + 20, _sum5);

                _sum6 = _mm_comp_fmadd_ps(_k00, _r06, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k01, _r07, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k02, _r08, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k10, _r16, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k11, _r17, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k12, _r18, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k20, _r26, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k21, _r27, _sum6);
                _sum6 = _mm_comp_fmadd_ps(_k22, _r28, _sum6);

                __m128 _sum7 = _bias0;
                __m128 _r09 = _mm_load_ps(r0 + 36);
                __m128 _r19 = _mm_load_ps(r1 + 36);
                __m128 _r29 = _mm_load_ps(r2 + 36);
                _mm_store_ps(outptr0 + 24, _sum6);

                _sum7 = _mm_comp_fmadd_ps(_k00, _r07, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k01, _r08, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k02, _r09, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k10, _r17, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k11, _r18, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k12, _r19, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k20, _r27, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k21, _r28, _sum7);
                _sum7 = _mm_comp_fmadd_ps(_k22, _r29, _sum7);
                _mm_store_ps(outptr0 + 28, _sum7);

                r0 += 32;
                r1 += 32;
                r2 += 32;
                outptr0 += 32;
            }
            for (; j + 3 < outw; j += 4)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                __m128 _sum2 = _bias0;
                __m128 _r04 = _mm_load_ps(r0 + 16);
                __m128 _r14 = _mm_load_ps(r1 + 16);
                __m128 _r24 = _mm_load_ps(r2 + 16);
                _mm_store_ps(outptr0 + 4, _sum1);

                _sum2 = _mm_comp_fmadd_ps(_k00, _r02, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k01, _r03, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k02, _r04, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k10, _r12, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k11, _r13, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k12, _r14, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k20, _r22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k21, _r23, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_k22, _r24, _sum2);

                __m128 _sum3 = _bias0;
                __m128 _r05 = _mm_load_ps(r0 + 20);
                __m128 _r15 = _mm_load_ps(r1 + 20);
                __m128 _r25 = _mm_load_ps(r2 + 20);
                _mm_store_ps(outptr0 + 8, _sum2);

                _sum3 = _mm_comp_fmadd_ps(_k00, _r03, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k01, _r04, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k02, _r05, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k10, _r13, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k11, _r14, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k12, _r15, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k20, _r23, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k21, _r24, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_k22, _r25, _sum3);

                _mm_store_ps(outptr0 + 12, _sum3);

                r0 += 16;
                r1 += 16;
                r2 += 16;
                outptr0 += 16;
            }
            for (; j + 1 < outw; j += 2)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                __m128 _sum1 = _bias0;
                __m128 _r03 = _mm_load_ps(r0 + 12);
                __m128 _r13 = _mm_load_ps(r1 + 12);
                __m128 _r23 = _mm_load_ps(r2 + 12);
                _mm_store_ps(outptr0, _sum0);

                _sum1 = _mm_comp_fmadd_ps(_k00, _r01, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k01, _r02, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k02, _r03, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k10, _r11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k11, _r12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k12, _r13, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k20, _r21, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k21, _r22, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_k22, _r23, _sum1);

                _mm_store_ps(outptr0 + 4, _sum1);

                r0 += 8;
                r1 += 8;
                r2 += 8;
                outptr0 += 8;
            }
            for (; j < outw; j++)
            {
                __m128 _sum0 = _bias0;

                __m128 _r00 = _mm_load_ps(r0);
                __m128 _r01 = _mm_load_ps(r0 + 4);
                __m128 _r02 = _mm_load_ps(r0 + 8);
                __m128 _r10 = _mm_load_ps(r1);
                __m128 _r11 = _mm_load_ps(r1 + 4);
                __m128 _r12 = _mm_load_ps(r1 + 8);
                __m128 _r20 = _mm_load_ps(r2);
                __m128 _r21 = _mm_load_ps(r2 + 4);
                __m128 _r22 = _mm_load_ps(r2 + 8);

                _sum0 = _mm_comp_fmadd_ps(_k00, _r00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k01, _r01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k02, _r02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k10, _r10, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k11, _r11, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k12, _r12, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k20, _r20, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k21, _r21, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_k22, _r22, _sum0);

                _mm_store_ps(outptr0, _sum0);

                r0 += 4;
                r1 += 4;
                r2 += 4;
                outptr0 += 4;
            }

            r0 += 2 * 4;
            r1 += 2 * 4;
            r2 += 2 * 4;
        }
    }
}